

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

Declaration * __thiscall
CPP::WriteInitialization::findDeclaration
          (Declaration *__return_storage_ptr__,WriteInitialization *this,QString *name)

{
  Data *pDVar1;
  DomWidget *ui_widget;
  DomAction *ui_action;
  DomButtonGroup *ui_group;
  
  ui_widget = Driver::widgetByName(this->m_driver,name);
  if (ui_widget != (DomWidget *)0x0) {
    Driver::findOrInsertWidget(&__return_storage_ptr__->name,this->m_driver,ui_widget);
    pDVar1 = (ui_widget->m_attr_class).d.d;
    (__return_storage_ptr__->className).d.d = pDVar1;
    (__return_storage_ptr__->className).d.ptr = (ui_widget->m_attr_class).d.ptr;
    (__return_storage_ptr__->className).d.size = (ui_widget->m_attr_class).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (ui_widget != (DomWidget *)0x0) {
      return __return_storage_ptr__;
    }
  }
  ui_action = Driver::actionByName(this->m_driver,name);
  if (ui_action == (DomAction *)0x0) {
    ui_group = Driver::findButtonGroup(this->m_driver,name);
    if (ui_group == (DomButtonGroup *)0x0) {
      (__return_storage_ptr__->className).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->className).d.size = 0;
      (__return_storage_ptr__->name).d.size = 0;
      (__return_storage_ptr__->className).d.d = (Data *)0x0;
      (__return_storage_ptr__->name).d.d = (Data *)0x0;
      (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
    }
    else {
      Driver::findOrInsertButtonGroup(&__return_storage_ptr__->name,this->m_driver,ui_group);
      (__return_storage_ptr__->className).d.d = (Data *)0x0;
      (__return_storage_ptr__->className).d.ptr = L"QButtonGroup";
      (__return_storage_ptr__->className).d.size = 0xc;
    }
  }
  else {
    Driver::findOrInsertAction(&__return_storage_ptr__->name,this->m_driver,ui_action);
    (__return_storage_ptr__->className).d.d = (Data *)0x0;
    (__return_storage_ptr__->className).d.ptr = L"QAction";
    (__return_storage_ptr__->className).d.size = 7;
  }
  return __return_storage_ptr__;
}

Assistant:

WriteInitialization::Declaration WriteInitialization::findDeclaration(const QString &name)
{
    if (const DomWidget *widget = m_driver->widgetByName(name))
        return {m_driver->findOrInsertWidget(widget), widget->attributeClass()};
    if (const DomAction *action = m_driver->actionByName(name))
        return {m_driver->findOrInsertAction(action), QStringLiteral("QAction")};
    if (const DomButtonGroup *group = m_driver->findButtonGroup(name))
         return {m_driver->findOrInsertButtonGroup(group), QStringLiteral("QButtonGroup")};
    return {};
}